

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandGameMode::Tick
          (CommandGameMode *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  uint uVar1;
  uint uVar2;
  bool truth;
  
  SBarInfoCommandFlowControl::Tick
            (&this->super_SBarInfoCommandFlowControl,block,statusBar,hudChanged);
  if (multiplayer == false) {
    uVar2 = *(uint *)&(this->super_SBarInfoCommandFlowControl).field_0x34;
    truth = true;
    if (((uVar2 & 1) != 0) || ((uVar2 & 4) != 0 && deathmatch.Value != 0)) goto LAB_004ba760;
  }
  else {
    uVar2 = *(uint *)&(this->super_SBarInfoCommandFlowControl).field_0x34;
    truth = true;
    if (deathmatch.Value == 0) {
      uVar1 = uVar2 & 2;
    }
    else {
      uVar1 = uVar2 & 4;
    }
    if (uVar1 != 0) goto LAB_004ba760;
  }
  if (teamplay.Value == true) {
    truth = SUB41((uVar2 & 8) >> 3,0);
  }
  else {
    truth = false;
  }
LAB_004ba760:
  SBarInfoCommandFlowControl::SetTruth
            (&this->super_SBarInfoCommandFlowControl,truth,block,statusBar);
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoCommandFlowControl::Tick(block, statusBar, hudChanged);

			SetTruth((!multiplayer && (modes & SINGLEPLAYER)) ||
				(deathmatch && (modes & DEATHMATCH)) ||
				(multiplayer && !deathmatch && (modes & COOPERATIVE)) ||
				(teamplay && (modes & TEAMGAME)), block, statusBar);
		}